

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void subscript_suite::create_map_key(void)

{
  type tVar1;
  basic_variable<std::allocator<char>> *pbVar2;
  basic_variable<std::allocator<char>_> *pbVar3;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  double local_190;
  basic_variable<std::allocator<char>_> local_188;
  basic_variable<std::allocator<char>_> local_158;
  int local_11c;
  basic_variable<std::allocator<char>_> local_118;
  basic_variable<std::allocator<char>_> local_e8;
  bool local_a9;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_68,"alpha");
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_68);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=(pbVar2,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,"alpha");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_a8);
  local_a9 = true;
  tVar1 = trial::dynamic::operator==(pbVar3,&local_a9);
  boost::detail::test_impl
            ("data[\"alpha\"] == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xdca,"void subscript_suite::create_map_key()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8,"bravo");
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=(pbVar2,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_118,"bravo");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_118);
  local_11c = 2;
  tVar1 = trial::dynamic::operator==(pbVar3,&local_11c);
  boost::detail::test_impl
            ("data[\"bravo\"] == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xdcc,"void subscript_suite::create_map_key()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,"charlie");
  pbVar2 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_158);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=(pbVar2,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_188,"charlie");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_188);
  local_190 = 3.0;
  tVar1 = trial::dynamic::operator==(pbVar3,&local_190);
  boost::detail::test_impl
            ("data[\"charlie\"] == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xdce,"void subscript_suite::create_map_key()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1c8,"delta");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=(pbVar3,"beryllium");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1f8,"delta");
  pbVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_1f8);
  tVar1 = trial::dynamic::operator==(pbVar3,(char (*) [10])"beryllium");
  boost::detail::test_impl
            ("data[\"delta\"] == \"beryllium\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xdd0,"void subscript_suite::create_map_key()",tVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void create_map_key()
{
    variable data;
    data["alpha"] = true;
    TRIAL_PROTOCOL_TEST(data["alpha"] == true);
    data["bravo"] = 2;
    TRIAL_PROTOCOL_TEST(data["bravo"] == 2);
    data["charlie"] = 3.0;
    TRIAL_PROTOCOL_TEST(data["charlie"] == 3.0);
    data["delta"] = "beryllium";
    TRIAL_PROTOCOL_TEST(data["delta"] == "beryllium");
}